

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O0

double fcssx(double *b,int pq,void *params)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  void *__ptr;
  void *__ptr_00;
  long lVar13;
  double dVar14;
  xlik_css_object obj;
  double *reg;
  double *theta;
  double *phi;
  int naram;
  int M;
  int ncond;
  int iter;
  int N;
  int j;
  int i;
  int iq;
  int ip;
  int jm;
  int offset;
  int D;
  int d;
  int s;
  int qs;
  int ps;
  int q;
  int p;
  double temp;
  double ssq;
  double value;
  void *params_local;
  int pq_local;
  double *b_local;
  
  iVar10 = *params + *(int *)((long)params + 0xc) * *(int *)((long)params + 0x10);
  iVar11 = *(int *)((long)params + 8) + *(int *)((long)params + 0xc) * *(int *)((long)params + 0x18)
  ;
  iVar1 = *(int *)((long)params + 0x28);
  iVar2 = *params;
  iVar3 = *(int *)((long)params + 0x10);
  iVar4 = *(int *)((long)params + 8);
  iVar5 = *(int *)((long)params + 0x18);
  iVar6 = *(int *)((long)params + 0xc);
  iVar7 = *(int *)((long)params + 0x2c);
  iVar8 = *(int *)((long)params + 0x58);
  iVar12 = iVar2 + iVar6 * iVar3;
  __ptr = malloc((long)iVar10 << 3);
  __ptr_00 = malloc((long)iVar11 << 3);
  for (N = 0; iVar9 = iVar2, N < iVar2; N = N + 1) {
    *(double *)((long)__ptr + (long)N * 8) = b[N];
  }
  while (N = iVar9, N < iVar10) {
    *(undefined8 *)((long)__ptr + (long)N * 8) = 0;
    iVar9 = N + 1;
  }
  for (N = 0; iVar9 = iVar4, N < iVar4; N = N + 1) {
    *(double *)((long)__ptr_00 + (long)N * 8) = b[N + iVar2];
  }
  while (N = iVar9, N < iVar11) {
    *(undefined8 *)((long)__ptr_00 + (long)N * 8) = 0;
    iVar9 = N + 1;
  }
  for (iter = 0; iter < iVar3; iter = iter + 1) {
    lVar13 = (long)((iter + 1) * iVar6 + -1);
    *(double *)((long)__ptr + lVar13 * 8) =
         b[iVar2 + iVar4 + iter] + *(double *)((long)__ptr + lVar13 * 8);
    for (N = 0; N < iVar2; N = N + 1) {
      lVar13 = (long)((iter + 1) * iVar6 + N);
      *(double *)((long)__ptr + lVar13 * 8) =
           -b[N] * b[iVar2 + iVar4 + iter] + *(double *)((long)__ptr + lVar13 * 8);
    }
  }
  for (iter = 0; iter < iVar5; iter = iter + 1) {
    lVar13 = (long)((iter + 1) * iVar6 + -1);
    *(double *)((long)__ptr_00 + lVar13 * 8) =
         b[iVar2 + iVar4 + iVar3 + iter] + *(double *)((long)__ptr_00 + lVar13 * 8);
    for (N = 0; N < iVar4; N = N + 1) {
      lVar13 = (long)((iter + 1) * iVar6 + N);
      *(double *)((long)__ptr_00 + lVar13 * 8) =
           b[N + iVar2] * b[iVar2 + iVar4 + iVar3 + iter] + *(double *)((long)__ptr_00 + lVar13 * 8)
      ;
    }
  }
  for (N = 0; N < iVar12; N = N + 1) {
    *(undefined8 *)((long)params + (long)(iVar8 + iVar1 + N) * 8 + 0x60) = 0;
  }
  if (0 < *(int *)((long)params + 0x2c)) {
    for (N = 0; N < iVar1; N = N + 1) {
      _q = *(double *)((long)params + (long)(iVar8 + iVar1 * 2 + N) * 8 + 0x60);
      for (iter = 0; iter < iVar7; iter = iter + 1) {
        _q = -*(double *)
               ((long)params + (long)(iter * iVar1 + N) * 8 + (long)(iVar8 + iVar1 * 3) * 8 + 0x60)
             * b[iVar2 + iVar4 + iVar3 + iVar5 + iter] + _q;
      }
      *(double *)((long)params + (long)(iVar8 + N) * 8 + 0x60) = _q;
    }
  }
  M = 0;
  temp = 0.0;
  for (N = iVar12; N < iVar1; N = N + 1) {
    M = M + 1;
    _q = *(double *)((long)params + (long)(iVar8 + N) * 8 + 0x60);
    for (iter = 0; iter < iVar10; iter = iter + 1) {
      _q = -*(double *)((long)__ptr + (long)iter * 8) *
           *(double *)((long)params + (long)(((iVar8 + N) - iter) + -1) * 8 + 0x60) + _q;
    }
    iq = iVar11;
    if (N - iVar12 < iVar11) {
      iq = N - iVar12;
    }
    for (iter = 0; iter < iq; iter = iter + 1) {
      _q = -*(double *)((long)__ptr_00 + (long)iter * 8) *
           *(double *)((long)params + (long)(((iVar8 + iVar1 + N) - iter) + -1) * 8 + 0x60) + _q;
    }
    *(double *)((long)params + (long)(iVar8 + iVar1 + N) * 8 + 0x60) = _q;
    temp = _q * _q + temp;
  }
  *(double *)((long)params + 0x48) = temp;
  *(int *)((long)params + 0x30) = M;
  dVar14 = log(temp / (double)M);
  *(double *)((long)params + 0x50) = dVar14 * 0.5;
  free(__ptr);
  free(__ptr_00);
  return dVar14 * 0.5;
}

Assistant:

double fcssx(double *b, int pq, void *params) {
	double value, ssq,temp;
	int p, q, ps, qs, s, d, D, offset,jm;
	int ip, iq, i, j, N,iter,ncond,M,naram;
	double *phi, *theta,*reg;

	value = ssq =  0.0;
	
	xlik_css_object obj = (xlik_css_object)params;

	ip = obj->p + (obj->s * obj->P);
	iq = obj->q + (obj->s * obj->Q);

	N = obj->N;
	p = obj->p;
	ps = obj->P;
	q = obj->q;
	qs = obj->Q;
	s = obj->s;
	M = obj->M;
	d = obj->d;
	D = obj->D;

	offset = obj->offset;
	ncond = p + s* ps;
	naram = p + q + ps + qs;

	//ncond = ncond + ncond1;

	reg = &obj->x[offset+3*N];

	//printf("\n %d %d %d \n", s,ps, qs);

	phi = (double*)malloc(sizeof(double)* ip);
	theta = (double*)malloc(sizeof(double)* iq);



	for (i = 0; i < p; ++i) {
		phi[i] = b[i];
	}

	for (i = p; i < ip; ++i) {
		phi[i] = 0.0;
	}

	for (i = 0; i < q; ++i) {
		theta[i] = b[i + p];
	}

	for (i = q; i < iq; ++i) {
		theta[i] = 0.0;
	}

	for (j = 0; j < ps; ++j) {
		phi[(j + 1)*s - 1] += b[p + q + j];
		for (i = 0; i < p; ++i) {
			phi[(j + 1)*s + i] -= b[i] * b[p + q + j];
		}
	}

	for (j = 0; j < qs; ++j) {
		theta[(j + 1)*s - 1] += b[p + q + ps + j];
		for (i = 0; i < q; ++i) {
			theta[(j + 1)*s + i] += b[i + p] * b[p + q + ps + j];
		}
	}
	//mdisplay(theta, 1, q + s*qs);
	//mdisplay(b, 1, p + q + ps + qs);
	for (i = 0; i < ncond; ++i) {
		obj->x[offset+N + i] = 0.0;
	}


	if (obj->M > 0) {
		for (i = 0; i < N; ++i) {
			temp = obj->x[offset + 2 * N + i];
			for(j = 0; j < M;++j) {
				temp -= reg[j*N+i]*b[naram+j];
			}
			obj->x[offset + i] = temp;
		}
	}
	iter = 0;
	ssq = 0.0;
	for (i = ncond; i < N; ++i) {
		iter++;
		temp = obj->x[offset+i];

		for (j = 0; j < ip; ++j) {
			temp = temp - phi[j] * obj->x[offset + i - j - 1];
		}

		if (i - ncond < iq) {
			jm = i - ncond;
		}
		else {
			jm = iq;
		}

		for (j = 0; j < jm; ++j) {
			temp = temp - theta[j] * obj->x[offset+N + i - j - 1];
		}

		obj->x[offset+N + i] = temp;
		ssq += temp * temp;
	}
	obj->ssq = ssq;
	obj->Nmncond = iter;
	value = 0.5 * log(ssq / (double)iter);
	obj->loglik = value;

	free(phi);
	free(theta);
	return value;
}